

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraKateGenerator::CreateDummyKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  byte bVar1;
  string *psVar2;
  ostream *poVar3;
  undefined1 local_290 [8];
  cmGeneratedFileStream fout;
  undefined1 local_38 [8];
  string filename;
  cmLocalGenerator *lg_local;
  cmExtraKateGenerator *this_local;
  
  filename.field_2._8_8_ = lg;
  psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  std::__cxx11::string::string((string *)local_38,(string *)psVar2);
  std::__cxx11::string::operator+=((string *)local_38,"/");
  std::__cxx11::string::operator+=((string *)local_38,(string *)&this->ProjectName);
  std::__cxx11::string::operator+=((string *)local_38,".kateproject");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_290,(string *)local_38,false,None);
  bVar1 = std::ios::operator!((ios *)(local_290 + (long)*(_func_int **)((long)local_290 + -0x18)));
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)local_290,"#Generated by ");
    psVar2 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)psVar2);
    std::operator<<(poVar3,", do not edit.\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_290);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraKateGenerator::CreateDummyKateProjectFile(
  const cmLocalGenerator* lg) const
{
  std::string filename = lg->GetBinaryDirectory();
  filename += "/";
  filename += this->ProjectName;
  filename += ".kateproject";
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  fout << "#Generated by " << cmSystemTools::GetCMakeCommand()
       << ", do not edit.\n";
}